

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O1

int ngram_model_casefold(ngram_model_t *model,int kase)

{
  uint8 uVar1;
  hash_table_t *h;
  char *cp;
  void *pvVar2;
  void *val;
  
  uVar1 = model->writable;
  model->writable = '\x01';
  h = hash_table_new(model->n_words,0);
  if (0 < model->n_words) {
    val = (void *)0x0;
    do {
      if (uVar1 == '\0') {
        cp = __ckd_salloc__(model->word_str[(long)val],
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                            ,0x147);
      }
      else {
        cp = model->word_str[(long)val];
      }
      if ((*cp != '<') && (*cp != '[')) {
        if (kase == 1) {
          lcase(cp);
        }
        else if (kase == 0) {
          ucase(cp);
        }
      }
      model->word_str[(long)val] = cp;
      pvVar2 = hash_table_enter(h,model->word_str[(long)val],val);
      if (val != (void *)((ulong)pvVar2 & 0xffffffff)) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                ,0x15e,"Duplicate word in dictionary after conversion: %s\n",
                model->word_str[(long)val]);
      }
      val = (void *)((long)val + 1);
    } while ((long)val < (long)model->n_words);
  }
  hash_table_free(model->wid);
  model->wid = h;
  return 0;
}

Assistant:

int
ngram_model_casefold(ngram_model_t * model, int kase)
{
    int writable, i;
    hash_table_t *new_wid;

    /* Were word strings already allocated? */
    writable = model->writable;
    /* Either way, we are going to allocate some word strings. */
    model->writable = TRUE;

    /* And, don't forget, we need to rebuild the word to unigram ID
     * mapping. */
    new_wid = hash_table_new(model->n_words, FALSE);
    for (i = 0; i < model->n_words; ++i) {
        char *outstr;
        if (writable) {
            outstr = model->word_str[i];
        }
        else {
            outstr = ckd_salloc(model->word_str[i]);
        }
        /* Don't case-fold <tags> or [classes] */
        if (outstr[0] == '<' || outstr[0] == '[') {
        }
        else {
            switch (kase) {
            case NGRAM_UPPER:
                ucase(outstr);
                break;
            case NGRAM_LOWER:
                lcase(outstr);
                break;
            default:
                ;
            }
        }
        model->word_str[i] = outstr;

        /* Now update the hash table.  We might have terrible
         * collisions here, so warn about them. */
        if (hash_table_enter_int32(new_wid, model->word_str[i], i) != i) {
            E_WARN("Duplicate word in dictionary after conversion: %s\n",
                   model->word_str[i]);
        }
    }
    /* Swap out the hash table. */
    hash_table_free(model->wid);
    model->wid = new_wid;
    return 0;
}